

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 IVar8;
  ImGuiColumns *pIVar9;
  float fVar10;
  ImRect bb;
  ImVec2 local_50;
  ImRect local_48;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    uVar1 = (flags & 3U) - 1;
    if ((flags & 3U ^ uVar1) <= uVar1) {
      __assert_fail("ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0x4d1,"void ImGui::SeparatorEx(ImGuiSeparatorFlags)");
    }
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        fVar2 = (pIVar4->Pos).x;
        fVar10 = fVar2;
        if ((pIVar4->DC).GroupStack.Size != 0) {
          fVar10 = (pIVar4->DC).Indent.x + fVar2;
        }
        if ((flags & 4U) == 0) {
          pIVar9 = (ImGuiColumns *)0x0;
        }
        else {
          pIVar9 = (pIVar4->DC).CurrentColumns;
        }
        fVar3 = (pIVar4->Size).x;
        if (pIVar9 != (ImGuiColumns *)0x0) {
          PushColumnsBackground();
        }
        local_48.Min.y = (pIVar4->DC).CursorPos.y;
        local_48.Max.y = local_48.Min.y + 1.0;
        local_50.x = 0.0;
        local_50.y = 0.0;
        local_48.Min.x = fVar10;
        local_48.Max.x = fVar2 + fVar3;
        ItemSize(&local_50,-1.0);
        bVar7 = ItemAdd(&local_48,0,(ImRect *)0x0);
        if (bVar7) {
          pIVar5 = pIVar4->DrawList;
          local_50 = (ImVec2)(CONCAT44(local_48.Max.x,local_48.Min.y) << 0x20 |
                             (ulong)(uint)local_48.Max.x);
          IVar8 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar5,&local_48.Min,&local_50,IVar8,1.0);
          if (pIVar6->LogEnabled == true) {
            LogRenderedText(&local_48.Min,"--------------------------------",(char *)0x0);
          }
        }
        if (pIVar9 != (ImGuiColumns *)0x0) {
          PopColumnsBackground();
          pIVar9->LineMinY = (pIVar4->DC).CursorPos.y;
        }
      }
    }
    else {
      local_48.Min.y = (pIVar4->DC).CursorPos.y;
      local_48.Max.y = (pIVar4->DC).CurrLineSize.y + local_48.Min.y;
      local_48.Min.x = (pIVar4->DC).CursorPos.x;
      local_48.Max.x = local_48.Min.x + 1.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      ItemSize(&local_50,-1.0);
      bVar7 = ItemAdd(&local_48,0,(ImRect *)0x0);
      if (bVar7) {
        pIVar5 = pIVar4->DrawList;
        local_50.y = local_48.Min.y;
        local_50.x = local_48.Min.x;
        local_38.x = local_48.Min.x;
        local_38.y = local_48.Max.y;
        IVar8 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar5,&local_50,&local_38,IVar8,1.0);
        if (pIVar6->LogEnabled == true) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}